

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

re2 * __thiscall re2::FormatAnchor_abi_cxx11_(re2 *this,Anchor anchor)

{
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  Anchor local_14;
  re2 *prStack_10;
  Anchor anchor_local;
  
  local_14 = anchor;
  prStack_10 = this;
  if (anchor == kUnanchored) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"unanchored",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (anchor == kAnchored) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"anchored",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"???",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  return this;
}

Assistant:

static string FormatAnchor(Prog::Anchor anchor) {
  switch (anchor) {
    case Prog::kAnchored:
      return "anchored";
    case Prog::kUnanchored:
      return "unanchored";
  }
  return "???";
}